

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateSetLogFile(HelicsFederate fed,char *logFile,HelicsError *err)

{
  element_type *peVar1;
  Federate *pFVar2;
  allocator<char> local_39;
  undefined8 local_38;
  undefined8 local_30;
  
  pFVar2 = getFed(fed,err);
  if (pFVar2 != (Federate *)0x0) {
    peVar1 = (pFVar2->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -10;
        err->message = "Federate core is not connected";
      }
    }
    else {
      if (logFile == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_38,&gHelicsEmptyStr_abi_cxx11_);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,logFile,&local_39);
      }
      (*peVar1->_vptr_Core[0x59])(peVar1,local_30,local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void helicsFederateSetLogFile(HelicsFederate fed, const char* logFile, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    const auto& corePtr = fedObj->getCorePointer();

    try {
        if (corePtr) {
            corePtr->setLogFile(AS_STRING(logFile));
            // LCOV_EXCL_START
        } else {  // this can theoretically happen but it would be pretty odd
            assignError(err, HELICS_ERROR_INVALID_FUNCTION_CALL, invalidFederateCore);
            return;
            // LCOV_EXCL_STOP
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}